

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Decode
          (Aggregate_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  bool bVar1;
  KUINT16 KVar2;
  KException *this_00;
  KDataStream *pKVar3;
  VariableDatum *this_01;
  int iVar4;
  KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> local_130;
  KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> local_118;
  VariableDatum *local_100;
  VariableDatum *p_1;
  KUINT32 datumID;
  KUINT16 pos;
  KUINT16 n;
  ushort local_b2;
  undefined1 local_b0 [6];
  KUINT16 l;
  ushort local_8a;
  undefined1 local_88 [6];
  KUINT16 k;
  ushort local_72;
  undefined1 local_70 [6];
  KUINT16 j;
  ushort local_5a;
  ushort local_58;
  uchar local_56 [4];
  KUINT16 i;
  KUINT16 p;
  KUINT8 ui8Padding;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Aggregate_State_PDU *this_local;
  
  this->m_bNeedsPadding = false;
  this->m_ui16NumberOfPaddingOctets = 0;
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::clear(&this->m_vAI);
  std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ::clear(&this->m_vEI);
  std::
  vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ::clear(&this->m_vSASL);
  std::
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ::clear(&this->m_vSESL);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::clear(&this->m_vVD);
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  this->m_ui32NumVariableDatum = 0;
  KVar2 = KDataStream::GetBufferSize(pKStack_18);
  iVar4 = 0;
  if ((local_19 & 1) != 0) {
    iVar4 = 0xc;
  }
  if (0x87 < (uint)KVar2 + iVar4) {
    Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
    pKVar3 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_AggregateID);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui8ForceID);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui8AggState);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_AggregateType).super_DataTypeBase);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui32Formation);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_AggregateMarking).super_DataTypeBase);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_Dimensions).super_DataTypeBase);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_Ori).super_DataTypeBase);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_CtrOfMassLoc).super_DataTypeBase);
    pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_Vel).super_DataTypeBase);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16NumAggregates);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16NumEntities);
    pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16NumSilentAggregateTypes);
    KDataStream::operator>>(pKVar3,&this->m_ui16NumSilentEntityTypes);
    calcPadding(this);
    bVar1 = needsPadding(this);
    if (bVar1) {
      local_56[0] = '\0';
      for (local_58 = 0; local_58 < this->m_ui16NumberOfPaddingOctets; local_58 = local_58 + 1) {
        KDataStream::operator>>(pKStack_18,local_56);
      }
    }
    for (local_5a = 0; local_5a < this->m_ui16NumAggregates; local_5a = local_5a + 1) {
      DATA_TYPE::AggregateIdentifier::AggregateIdentifier
                ((AggregateIdentifier *)local_70,pKStack_18);
      std::
      vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
      ::push_back(&this->m_vAI,(AggregateIdentifier *)local_70);
      DATA_TYPE::AggregateIdentifier::~AggregateIdentifier((AggregateIdentifier *)local_70);
    }
    for (local_72 = 0; local_72 < this->m_ui16NumEntities; local_72 = local_72 + 1) {
      DATA_TYPE::EntityIdentifier::EntityIdentifier((EntityIdentifier *)local_88,pKStack_18);
      std::
      vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
      ::push_back(&this->m_vEI,(EntityIdentifier *)local_88);
      DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)local_88);
    }
    calcPadding(this);
    if ((this->m_bNeedsPadding & 1U) != 0) {
      KDataStream::operator>>(pKStack_18,&this->m_ui16Padding1);
    }
    for (local_8a = 0; local_8a < this->m_ui16NumSilentAggregateTypes; local_8a = local_8a + 1) {
      DATA_TYPE::SilentAggregateSystem::SilentAggregateSystem
                ((SilentAggregateSystem *)local_b0,pKStack_18);
      std::
      vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
      ::push_back(&this->m_vSASL,(SilentAggregateSystem *)local_b0);
      DATA_TYPE::SilentAggregateSystem::~SilentAggregateSystem((SilentAggregateSystem *)local_b0);
    }
    for (local_b2 = 0; local_b2 < this->m_ui16NumSilentEntityTypes; local_b2 = local_b2 + 1) {
      DATA_TYPE::SilentEntitySystem::SilentEntitySystem((SilentEntitySystem *)&datumID,pKStack_18);
      std::
      vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
      ::push_back(&this->m_vSESL,(SilentEntitySystem *)&datumID);
      DATA_TYPE::SilentEntitySystem::~SilentEntitySystem((SilentEntitySystem *)&datumID);
    }
    KDataStream::operator>>(pKStack_18,&this->m_ui32NumVariableDatum);
    for (p_1._6_2_ = 0; (uint)p_1._6_2_ < this->m_ui32NumVariableDatum; p_1._6_2_ = p_1._6_2_ + 1) {
      p_1._4_2_ = KDataStream::GetCurrentWritePosition(pKStack_18);
      KDataStream::operator>>(pKStack_18,(uint *)&p_1);
      KDataStream::SetCurrentWritePosition(pKStack_18,p_1._4_2_);
      local_100 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                            ((KINT32)p_1,pKStack_18);
      if (local_100 == (VariableDatum *)0x0) {
        this_01 = (VariableDatum *)operator_new(0x28);
        DATA_TYPE::VariableDatum::VariableDatum(this_01,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::KRef_Ptr(&local_130,this_01);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
        ::push_back(&this->m_vVD,&local_130);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr(&local_130);
      }
      else {
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::KRef_Ptr(&local_118,local_100);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
        ::push_back(&this->m_vVD,&local_118);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr(&local_118);
      }
    }
    return;
  }
  local_56[1] = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_56[1] = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Aggregate_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    m_bNeedsPadding = false;
    m_ui16NumberOfPaddingOctets = 0;
    m_vAI.clear();
    m_vEI.clear();
    m_vSASL.clear();
    m_vSESL.clear();
    m_vVD.clear();
    m_ui16NumAggregates = 0;
    m_ui16NumEntities = 0;
    m_ui16NumSilentAggregateTypes = 0;
    m_ui16NumSilentEntityTypes = 0;
    m_ui32NumVariableDatum = 0;

    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AGGREGATE_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_AggregateID
           >> m_ui8ForceID
           >> m_ui8AggState
           >> KDIS_STREAM m_AggregateType
           >> m_ui32Formation
           >> KDIS_STREAM m_AggregateMarking
           >> KDIS_STREAM m_Dimensions
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_CtrOfMassLoc
           >> KDIS_STREAM m_Vel
           >> m_ui16NumAggregates
           >> m_ui16NumEntities
           >> m_ui16NumSilentAggregateTypes
           >> m_ui16NumSilentEntityTypes;

    // Does the PDU contain padding?
    calcPadding();

    if( needsPadding() )
    {
        KUINT8 ui8Padding = 0;
        for( KUINT16 p = 0; p < m_ui16NumberOfPaddingOctets; ++p )
        {
            stream >> ui8Padding;
        }
    }

    for( KUINT16 i = 0; i < m_ui16NumAggregates; ++i )
    {
        m_vAI.push_back( AggregateIdentifier( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumEntities; ++j )
    {
        m_vEI.push_back( EntityIdentifier( stream ) );
    }

    // Does the PDU contain padding?
    calcPadding();

    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }

    for( KUINT16 k = 0; k < m_ui16NumSilentAggregateTypes; ++k )
    {
        m_vSASL.push_back( SilentAggregateSystem( stream ) );
    }

    for( KUINT16 l = 0; l < m_ui16NumSilentEntityTypes; ++l )
    {
        m_vSESL.push_back( SilentEntitySystem( stream ) );
    }

    stream >> m_ui32NumVariableDatum;

    // VariableDatum
    for( KUINT16 n = 0; n < m_ui32NumVariableDatum; ++n )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVD.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVD.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}